

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int commit_record_message(ptls_message_emitter_t *_self)

{
  ulong uVar1;
  size_t sz;
  int ret;
  st_ptls_record_message_emitter_t *self;
  ptls_message_emitter_t *_self_local;
  
  if (_self->enc->aead == (ptls_aead_context_t *)0x0) {
    uVar1 = (_self->buf->off - (long)_self[1].buf) - 5;
    if (0x4000 < uVar1) {
      __assert_fail("sz <= PTLS_MAX_PLAINTEXT_RECORD_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                    ,0x2e8,"int commit_record_message(ptls_message_emitter_t *)");
    }
    *(uint8_t *)((long)&(_self[1].buf)->base + (long)(_self->buf->base + 3)) = (uint8_t)(uVar1 >> 8)
    ;
    *(uint8_t *)((long)&(_self[1].buf)->base + (long)(_self->buf->base + 4)) = (uint8_t)uVar1;
    sz._4_4_ = 0;
  }
  else {
    sz._4_4_ = buffer_encrypt_record(_self->buf,(size_t)_self[1].buf,_self->enc);
  }
  return sz._4_4_;
}

Assistant:

static int commit_record_message(ptls_message_emitter_t *_self)
{
    struct st_ptls_record_message_emitter_t *self = (void *)_self;
    int ret;

    if (self->super.enc->aead != NULL) {
        ret = buffer_encrypt_record(self->super.buf, self->rec_start, self->super.enc);
    } else {
        /* TODO allow CH,SH,HRR above 16KB */
        size_t sz = self->super.buf->off - self->rec_start - 5;
        assert(sz <= PTLS_MAX_PLAINTEXT_RECORD_SIZE);
        self->super.buf->base[self->rec_start + 3] = (uint8_t)(sz >> 8);
        self->super.buf->base[self->rec_start + 4] = (uint8_t)(sz);
        ret = 0;
    }

    return ret;
}